

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  int32_t iVar4;
  roaring_bitmap_t *prVar5;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  int next_pos1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  roaring_bitmap_t *empty_bitmap;
  int length2;
  int length1;
  uint8_t result_type;
  int32_t in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  uint8_t in_stack_ffffffffffffff4f;
  roaring_array_t *in_stack_ffffffffffffff50;
  roaring_array_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int iVar6;
  undefined4 in_stack_ffffffffffffff64;
  int iVar7;
  roaring_bitmap_t *in_stack_ffffffffffffff68;
  roaring_array_t *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff7c;
  _Bool local_71;
  _Bool local_65;
  uint8_t local_42;
  uint8_t local_41;
  int local_40;
  int local_3c;
  roaring_bitmap_t *local_38;
  roaring_bitmap_t *local_30;
  int local_24;
  int local_20;
  undefined1 local_19;
  roaring_array_t *local_18;
  roaring_array_t *local_10;
  roaring_bitmap_t *local_8;
  
  local_19 = 0;
  local_20 = ((roaring_array_t *)&in_RDI->size)->size;
  local_24 = ((roaring_array_t *)&in_RSI->size)->size;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_20 == 0) {
    prVar5 = roaring_bitmap_create();
    local_30 = prVar5;
    _Var1 = is_cow((roaring_bitmap_t *)local_10);
    local_65 = true;
    if (!_Var1) {
      local_65 = is_cow((roaring_bitmap_t *)local_18);
    }
    roaring_bitmap_set_copy_on_write(prVar5,local_65);
    local_8 = local_30;
  }
  else if (local_24 == 0) {
    local_8 = roaring_bitmap_copy(in_stack_ffffffffffffff68);
  }
  else {
    prVar5 = roaring_bitmap_create_with_capacity
                       ((uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    local_38 = prVar5;
    _Var1 = is_cow((roaring_bitmap_t *)local_10);
    local_71 = true;
    if (!_Var1) {
      local_71 = is_cow((roaring_bitmap_t *)local_18);
    }
    roaring_bitmap_set_copy_on_write(prVar5,local_71);
    local_3c = 0;
    local_40 = 0;
    do {
      while( true ) {
        while( true ) {
          uVar2 = ra_get_key_at_index(local_10,(uint16_t)local_3c);
          uVar3 = ra_get_key_at_index(local_18,(uint16_t)local_40);
          if (uVar2 != uVar3) break;
          ra_get_container_at_index(local_10,(uint16_t)local_3c,&local_41);
          ra_get_container_at_index(local_18,(uint16_t)local_40,&local_42);
          container_andnot((container_t *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (uint8_t)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                           in_stack_ffffffffffffff68,
                           (uint8_t)((uint)in_stack_ffffffffffffff64 >> 0x18),
                           (uint8_t *)in_stack_ffffffffffffff58);
          _Var1 = container_nonzero_cardinality
                            ((container_t *)
                             CONCAT17(in_stack_ffffffffffffff4f,
                                      CONCAT16(in_stack_ffffffffffffff4e,
                                               CONCAT24(in_stack_ffffffffffffff4c,
                                                        in_stack_ffffffffffffff48))),'\0');
          if (_Var1) {
            ra_append((roaring_array_t *)
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (uint16_t)((ulong)in_stack_ffffffffffffff58 >> 0x30),in_stack_ffffffffffffff50
                      ,in_stack_ffffffffffffff4f);
          }
          else {
            container_free(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
          }
          local_3c = local_3c + 1;
          local_40 = local_40 + 1;
          if ((local_3c == local_20) || (local_40 == local_24)) goto LAB_00134a25;
        }
        if (uVar3 <= uVar2) break;
        iVar4 = ra_advance_until(in_stack_ffffffffffffff50,
                                 CONCAT11(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff4e),
                                 in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff68 = local_38;
        in_stack_ffffffffffffff70 = local_10;
        in_stack_ffffffffffffff78 = local_3c;
        in_stack_ffffffffffffff7c = iVar4;
        is_cow((roaring_bitmap_t *)local_10);
        ra_append_copy_range
                  ((roaring_array_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,(int32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                   (int32_t)in_stack_ffffffffffffff50,(_Bool)in_stack_ffffffffffffff4f);
        local_3c = iVar4;
        if (iVar4 == local_20) goto LAB_00134a25;
      }
      local_40 = ra_advance_until(in_stack_ffffffffffffff50,
                                  CONCAT11(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff4e),
                                  in_stack_ffffffffffffff48);
    } while (local_40 != local_24);
LAB_00134a25:
    if (local_40 == local_24) {
      prVar5 = local_38;
      iVar6 = local_3c;
      iVar7 = local_20;
      is_cow((roaring_bitmap_t *)local_10);
      ra_append_copy_range
                ((roaring_array_t *)CONCAT44(iVar7,iVar6),local_10,(int32_t)((ulong)prVar5 >> 0x20),
                 (int32_t)prVar5,(_Bool)in_stack_ffffffffffffff4f);
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap,
                                         is_cow(x1) || is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_andnot(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}